

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Calls.cpp
# Opt level: O0

PSNodesSeq * __thiscall
dg::pta::LLVMPointerGraphBuilder::createFuncptrCall
          (LLVMPointerGraphBuilder *this,CallInst *CInst,Value *calledVal)

{
  PSNode *n;
  PSNode *this_00;
  PSNodesSeq *pPVar1;
  CallInst *in_RSI;
  PSNode *ret_call;
  PSNode *call_funcptr;
  PSNode *op;
  PointerGraph *in_stack_ffffffffffffff80;
  LLVMPointerGraphBuilder *in_stack_ffffffffffffff88;
  PointerGraph *in_stack_ffffffffffffff90;
  PSNodesSeq *in_stack_ffffffffffffffb0;
  Value *in_stack_ffffffffffffffb8;
  LLVMPointerGraphBuilder *in_stack_ffffffffffffffc0;
  
  getOperand(in_stack_ffffffffffffff88,(Value *)in_stack_ffffffffffffff80);
  n = PointerGraph::create<(dg::pta::PSNodeType)9,dg::pta::PSNode*&>
                (in_stack_ffffffffffffff90,(PSNode **)in_stack_ffffffffffffff88);
  this_00 = PointerGraph::create<(dg::pta::PSNodeType)10>(in_stack_ffffffffffffff80);
  PSNode::setPairedNode(this_00,n);
  PSNode::setPairedNode(n,this_00);
  SubgraphNode<dg::pta::PSNode>::setUserData<llvm::CallInst>
            (&n->super_SubgraphNode<dg::pta::PSNode>,in_RSI);
  PSNodesSeq::PSNodesSeq
            ((PSNodesSeq *)&stack0xffffffffffffff90,(initializer_list<dg::pta::PSNode_*> *)this_00);
  pPVar1 = addNode(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
  PSNodesSeq::~PSNodesSeq((PSNodesSeq *)0x1bac68);
  return pPVar1;
}

Assistant:

LLVMPointerGraphBuilder::PSNodesSeq &
LLVMPointerGraphBuilder::createFuncptrCall(const llvm::CallInst *CInst,
                                           const llvm::Value *calledVal) {
    // just the call_funcptr and call_return nodes are created and
    // when the pointers are resolved during analysis, the graph
    // will be dynamically created and it will replace these nodes
    PSNode *op = getOperand(calledVal);
    PSNode *call_funcptr = PS.create<PSNodeType::CALL_FUNCPTR>(op);
    PSNode *ret_call = PS.create<PSNodeType::CALL_RETURN>();

    ret_call->setPairedNode(call_funcptr);
    call_funcptr->setPairedNode(ret_call);

    call_funcptr->setUserData(const_cast<llvm::CallInst *>(CInst));

    return addNode(CInst, {call_funcptr, ret_call});
}